

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  undefined1 local_2820 [8];
  Game game;
  Renderer renderer;
  size_t kGridHeight;
  size_t kGridWidth;
  size_t kScreenHeight;
  size_t kScreenWidth;
  size_t kMsPerFrame;
  size_t kFramesPerSecond;
  
  Renderer::Renderer((Renderer *)&game.score,0x280,0x280,0x20,0x20);
  Game::Game((Game *)local_2820,0x20,0x20);
  Game::Run((Game *)local_2820,(Renderer *)&game.score,0x10);
  std::operator<<((ostream *)&std::cout,"Game has terminated successfully!\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Score: ");
  iVar1 = Game::GetScore((Game *)local_2820);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Size: ");
  iVar1 = Game::GetSize((Game *)local_2820);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  Game::~Game((Game *)local_2820);
  Renderer::~Renderer((Renderer *)&game.score);
  return 0;
}

Assistant:

int main() {
  constexpr std::size_t kFramesPerSecond{60};
  constexpr std::size_t kMsPerFrame{1000 / kFramesPerSecond};
  constexpr std::size_t kScreenWidth{640};
  constexpr std::size_t kScreenHeight{640};
  constexpr std::size_t kGridWidth{32};
  constexpr std::size_t kGridHeight{32};
    
  Renderer renderer(kScreenWidth, kScreenHeight, kGridWidth, kGridHeight);
  Game game(kGridWidth, kGridHeight);
  game.Run(renderer, kMsPerFrame);
  std::cout << "Game has terminated successfully!\n";
  std::cout << "Score: " << game.GetScore() << "\n";
  std::cout << "Size: " << game.GetSize() << "\n";
  return 0;
}